

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O1

shared_ptr<JointPolicy> __thiscall BGIPSolution::GetJointPolicy(BGIPSolution *this)

{
  int *piVar1;
  long lVar2;
  long *plVar3;
  shared_count sVar4;
  E *this_00;
  shared_count extraout_RDX;
  long in_RSI;
  shared_ptr<JointPolicy> sVar5;
  Interface_ProblemToPolicyDiscretePure *local_28;
  shared_count asStack_20 [2];
  
  if (*(char *)(in_RSI + 0x20) == '\x01') {
    if (*(long *)(in_RSI + 0x38) == 0) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,"BGIPSolution::GetJointPolicy - No solution left in fixed size queue");
LAB_003859b4:
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    lVar2 = *(long *)(*(long *)(in_RSI + 0x28) + 0x10);
    local_28 = *(Interface_ProblemToPolicyDiscretePure **)(lVar2 + 0x10);
    asStack_20[0].pi_ = *(sp_counted_base **)(lVar2 + 0x18);
    if (*(long *)(lVar2 + 0x18) != 0) {
      LOCK();
      piVar1 = (int *)(*(long *)(lVar2 + 0x18) + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  else {
    plVar3 = *(long **)(in_RSI + 0x68);
    if (plVar3[1] == *plVar3) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,"BGIPSolution::GetJointPolicy - No solution left in inf size queue");
      goto LAB_003859b4;
    }
    lVar2 = *(long *)*plVar3;
    local_28 = *(Interface_ProblemToPolicyDiscretePure **)(lVar2 + 0x10);
    asStack_20[0].pi_ = *(sp_counted_base **)(lVar2 + 0x18);
    if (*(long *)(lVar2 + 0x18) != 0) {
      LOCK();
      piVar1 = (int *)(*(long *)(lVar2 + 0x18) + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  sVar4.pi_ = asStack_20[0].pi_;
  (this->_m_puShared).px = (element_type *)0x0;
  asStack_20[0].pi_ = (sp_counted_base *)0x0;
  this->_m_pu = local_28;
  (this->_m_puShared).px = (element_type *)sVar4.pi_;
  boost::detail::shared_count::~shared_count(asStack_20);
  sVar5.pn.pi_ = extraout_RDX.pi_;
  sVar5.px = (element_type *)this;
  return sVar5;
}

Assistant:

const boost::shared_ptr<JointPolicy> BGIPSolution::GetJointPolicy() const
{
    if(_m_useFixedCapacityPriorityQueue)
        if(_m_qFixedK.size() > 0)
            return(_m_qFixedK.top()->GetJPPV());
        else
            throw(E("BGIPSolution::GetJointPolicy - No solution left in fixed size queue"));
    else
        if(_m_qInfSize->size() > 0)
            return(_m_qInfSize->top()->GetJPPV());
        else
            throw(E("BGIPSolution::GetJointPolicy - No solution left in inf size queue"));
}